

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O2

void __thiscall QDtls::QDtls(QDtls *this,SslMode mode,QObject *parent)

{
  long lVar1;
  long *plVar2;
  QDtlsPrivate *this_00;
  QTlsBackend *pQVar3;
  long lVar4;
  QLoggingCategory *pQVar5;
  QDebug *pQVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  QDebug local_60;
  undefined1 local_58 [12];
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDtlsPrivate *)operator_new(0x80);
  QDtlsPrivate::QDtlsPrivate(this_00);
  QObject::QObject(&this->super_QObject,(QObjectPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_002d01d8;
  lVar1 = *(long *)&this->field_0x8;
  pQVar3 = QSslSocketPrivate::tlsBackendInUse();
  if (pQVar3 == (QTlsBackend *)0x0) {
    pQVar5 = QtPrivateLogging::lcSsl();
    if (((pQVar5->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_40 = pQVar5->name;
      local_58._0_4_ = 2;
      local_58._4_8_ = 0;
      uStack_4c = 0;
      local_44 = 0;
      QMessageLogger::warning(local_58,"No TLS backend found, QDtls is unsupported");
    }
  }
  else {
    lVar4 = (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,this,mode);
    plVar2 = *(long **)(lVar1 + 0x78);
    *(long *)(lVar1 + 0x78) = lVar4;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
      lVar4 = *(long *)(lVar1 + 0x78);
    }
    if (lVar4 == 0) {
      pQVar5 = QtPrivateLogging::lcSsl();
      if (((pQVar5->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_40 = pQVar5->name;
        local_58._0_4_ = 2;
        local_58._4_8_ = 0;
        uStack_4c = 0;
        local_44 = 0;
        QMessageLogger::warning();
        pQVar6 = QDebug::operator<<(&local_60,"TLS backend");
        (**(code **)(*(long *)pQVar3 + 0x90))(&QStack_78,pQVar3);
        pQVar6 = QDebug::operator<<(pQVar6,(QString *)&QStack_78);
        QDebug::operator<<(pQVar6,"does not support the protocol DTLS");
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
        QDebug::~QDebug(&local_60);
      }
    }
    QSslConfiguration::defaultDtlsConfiguration();
    setDtlsConfiguration(this,(QSslConfiguration *)local_58);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDtls::QDtls(QSslSocket::SslMode mode, QObject *parent)
    : QObject(*new QDtlsPrivate, parent)
{
    Q_D(QDtls);
    const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend found, QDtls is unsupported");
        return;
    }
    d->backend.reset(tlsBackend->createDtlsCryptograph(this, mode));
    if (!d->backend.get()) {
        qCWarning(lcSsl) << "TLS backend" << tlsBackend->backendName()
                         << "does not support the protocol DTLS";
    }
    setDtlsConfiguration(QSslConfiguration::defaultDtlsConfiguration());
}